

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O2

char RDL_checkGraphConnected(RDL_graph *gra)

{
  char *pcVar1;
  char *visited;
  ulong uVar2;
  char cVar3;
  ulong __size;
  
  __size = (ulong)gra->V;
  visited = (char *)malloc(__size);
  *visited = '\x01';
  for (uVar2 = 1; uVar2 < __size; uVar2 = uVar2 + 1) {
    visited[uVar2] = '\0';
  }
  uVar2 = 0;
  RDL_DFSvisit(gra,0,visited);
  do {
    if (__size == uVar2) {
      cVar3 = '\x01';
      goto LAB_0010795d;
    }
    pcVar1 = visited + uVar2;
    uVar2 = uVar2 + 1;
  } while (*pcVar1 != '\0');
  cVar3 = '\0';
LAB_0010795d:
  free(visited);
  return cVar3;
}

Assistant:

char RDL_checkGraphConnected(const RDL_graph *gra)
{
  unsigned i;
  char *visited;
  char result;
  result = 1;
  visited = malloc(gra->V * sizeof(*visited));
  visited[0] = 1; /*start vertex*/
  for(i=1; i<gra->V; ++i)
  {
    visited[i] = 0; /*unvisited*/
  }
  RDL_DFSvisit(gra, 0, visited);
  for(i=0; i<gra->V; ++i)
  {
    if(visited[i] == 0) /*one was unvisited*/
    {
      result = 0;
      break;
    }
  }

  free(visited);
  return result;
}